

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPrsBuild.c
# Opt level: O0

Bac_Man_t * Psr_ManBuildCba(char *pFileName,Vec_Ptr_t *vDes)

{
  int iVar1;
  int nOuts;
  int nObjs;
  int iVar2;
  Vec_Int_t *vMap_00;
  Vec_Int_t *vBoxes;
  Abc_Nam_t *pAVar3;
  Psr_Ntk_t *pNtk_00;
  Bac_Ntk_t *pBVar4;
  Vec_Int_t *vTmp;
  Vec_Int_t *vMap;
  Bac_Man_t *pNew;
  Psr_Ntk_t *pPStack_20;
  int i;
  Psr_Ntk_t *pNtk;
  Vec_Ptr_t *vDes_local;
  char *pFileName_local;
  
  pPStack_20 = Psr_ManRoot(vDes);
  iVar1 = Vec_PtrSize(vDes);
  vMap = (Vec_Int_t *)Bac_ManAlloc(pFileName,iVar1);
  iVar1 = Abc_NamObjNumMax(pPStack_20->pStrs);
  vMap_00 = Vec_IntStartFull(iVar1 + 1);
  iVar1 = Psr_NtkBoxNum(pPStack_20);
  vBoxes = Vec_IntAlloc(iVar1);
  Abc_NamDeref(((Bac_Man_t *)vMap)->pStrs);
  pAVar3 = Abc_NamRef(pPStack_20->pStrs);
  ((Bac_Man_t *)vMap)->pStrs = pAVar3;
  for (pNew._4_4_ = 0; iVar1 = Vec_PtrSize(vDes), pNew._4_4_ < iVar1; pNew._4_4_ = pNew._4_4_ + 1) {
    pPStack_20 = (Psr_Ntk_t *)Vec_PtrEntry(vDes,pNew._4_4_);
    pBVar4 = Bac_ManNtk((Bac_Man_t *)vMap,pNew._4_4_ + 1);
    iVar1 = Psr_NtkId(pPStack_20);
    iVar2 = Psr_NtkPiNum(pPStack_20);
    nOuts = Psr_NtkPoNum(pPStack_20);
    nObjs = Psr_NtkCountObjects(pPStack_20);
    Bac_NtkAlloc(pBVar4,iVar1,iVar2,nOuts,nObjs);
  }
  if ((((pPStack_20->field_0x4 & 1) == 0) &&
      ((((byte)pPStack_20->field_0x4 >> 1 & 1) == 0 ||
       (iVar1 = Psr_ManIsMapped(pPStack_20), iVar1 == 0)))) ||
     (iVar1 = Bac_NtkBuildLibrary((Bac_Man_t *)vMap), iVar1 != 0)) {
    for (pNew._4_4_ = 0; iVar1 = Vec_PtrSize(vDes), pNew._4_4_ < iVar1; pNew._4_4_ = pNew._4_4_ + 1)
    {
      pNtk_00 = (Psr_Ntk_t *)Vec_PtrEntry(vDes,pNew._4_4_);
      pBVar4 = Bac_ManNtk((Bac_Man_t *)vMap,pNew._4_4_ + 1);
      Psr_ManBuildNtk(pBVar4,vDes,pNtk_00,vMap_00,vBoxes);
    }
  }
  else {
    Bac_ManFree((Bac_Man_t *)vMap);
    vMap = (Vec_Int_t *)0x0;
  }
  iVar1 = Vec_IntCountEntry(vMap_00,-1);
  iVar2 = Vec_IntSize(vMap_00);
  if (iVar1 == iVar2) {
    Vec_IntFree(vMap_00);
    Vec_IntFree(vBoxes);
    return (Bac_Man_t *)vMap;
  }
  __assert_fail("Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrsBuild.c"
                ,0x157,"Bac_Man_t *Psr_ManBuildCba(char *, Vec_Ptr_t *)");
}

Assistant:

Bac_Man_t * Psr_ManBuildCba( char * pFileName, Vec_Ptr_t * vDes )
{
    Psr_Ntk_t * pNtk = Psr_ManRoot( vDes );  int i;
    Bac_Man_t * pNew = Bac_ManAlloc( pFileName, Vec_PtrSize(vDes) );
    Vec_Int_t * vMap = Vec_IntStartFull( Abc_NamObjNumMax(pNtk->pStrs) + 1 );
    Vec_Int_t * vTmp = Vec_IntAlloc( Psr_NtkBoxNum(pNtk) );
    Abc_NamDeref( pNew->pStrs );
    pNew->pStrs = Abc_NamRef( pNtk->pStrs );  
    Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
        Bac_NtkAlloc( Bac_ManNtk(pNew, i+1), Psr_NtkId(pNtk), Psr_NtkPiNum(pNtk), Psr_NtkPoNum(pNtk), Psr_NtkCountObjects(pNtk) );
    if ( (pNtk->fMapped || (pNtk->fSlices && Psr_ManIsMapped(pNtk))) && !Bac_NtkBuildLibrary(pNew) )
        Bac_ManFree(pNew), pNew = NULL;
    else 
        Vec_PtrForEachEntry( Psr_Ntk_t *, vDes, pNtk, i )
            Psr_ManBuildNtk( Bac_ManNtk(pNew, i+1), vDes, pNtk, vMap, vTmp );
    assert( Vec_IntCountEntry(vMap, -1) == Vec_IntSize(vMap) );
    Vec_IntFree( vMap );
    Vec_IntFree( vTmp );
//    Vec_StrPrint( &Bac_ManNtk(pNew, 1)->vType, 1 );
    return pNew;
}